

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

void insert_embryo_category
               (embryonic_ui_entry *embryo,char *name,wchar_t psource_index,wchar_t priority,
               _Bool priority_set,wchar_t ind)

{
  wchar_t *pwVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  wchar_t wVar4;
  undefined8 uVar5;
  char **ppcVar6;
  char *pcVar7;
  category_reference *pcVar8;
  embryonic_category_reference *peVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int unaff_EBP;
  long lVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  bool bVar17;
  wchar_t local_58;
  
  ppcVar6 = categories;
  wVar4 = n_category;
  lVar13 = (long)n_category;
  wVar15 = L'\0';
  wVar16 = n_category;
  do {
    if (wVar15 == wVar16) {
      unaff_EBP = 0;
      bVar17 = false;
      local_58 = wVar15;
    }
    else {
      wVar14 = (wVar15 + wVar16) / 2;
      iVar10 = strcmp(ppcVar6[wVar14],name);
      if (iVar10 == 0) {
        unaff_EBP = 1;
        bVar17 = false;
        local_58 = wVar14;
      }
      else {
        if (iVar10 < 0) {
          wVar15 = wVar14 + L'\x01';
          wVar14 = wVar16;
        }
        bVar17 = true;
        wVar16 = wVar14;
      }
    }
  } while (bVar17);
  if (unaff_EBP == 0) {
    if (wVar4 == nalloc_category) {
      if (L'\x3fffffff' < wVar4) {
        quit("Too many categories");
      }
      wVar4 = nalloc_category * 2;
      bVar17 = nalloc_category != L'\0';
      nalloc_category = L'\b';
      if (bVar17) {
        nalloc_category = wVar4;
      }
      ppcVar6 = (char **)mem_alloc((long)nalloc_category << 3);
      if (L'\0' < local_58) {
        memcpy(ppcVar6,categories,(ulong)(uint)local_58 << 3);
      }
      pcVar7 = string_make(name);
      lVar13 = (long)local_58;
      ppcVar6[lVar13] = pcVar7;
      if (n_category - local_58 != 0 && local_58 <= n_category) {
        memcpy(ppcVar6 + lVar13 + 1,categories + lVar13,(long)(n_category - local_58) << 3);
      }
      mem_free(categories);
      categories = ppcVar6;
    }
    else {
      if (local_58 < wVar4) {
        do {
          ppcVar6[lVar13] = ppcVar6[lVar13 + -1];
          lVar13 = lVar13 + -1;
        } while (local_58 < lVar13);
      }
      pcVar7 = string_make(name);
      categories[local_58] = pcVar7;
    }
    n_category = n_category + L'\x01';
  }
  wVar4 = embryo->entry->n_category;
  lVar13 = (long)wVar4;
  wVar16 = embryo->entry->nalloc_category;
  if (wVar4 == wVar16) {
    if (L'\x3fffffff' < wVar16) {
      quit("Too many categories for an ui_entry");
    }
    wVar4 = embryo->entry->nalloc_category;
    wVar16 = L'\x04';
    if (wVar4 != L'\0') {
      wVar16 = wVar4 * 2;
    }
    embryo->entry->nalloc_category = wVar16;
    if (embryo->exists == true) {
      pcVar8 = (category_reference *)mem_alloc((long)wVar16 << 4);
      if (L'\0' < ind) {
        memcpy(pcVar8,embryo->entry->categories,(ulong)(uint)ind << 4);
      }
      pcVar8[ind].name = categories[local_58];
      pcVar8[ind].priority = priority;
      pcVar8[ind].priority_set = priority_set;
      wVar4 = embryo->entry->n_category;
      iVar10 = wVar4 - ind;
      if (iVar10 != 0 && ind <= wVar4) {
        memcpy(pcVar8 + (long)ind + 1,embryo->entry->categories + ind,(long)iVar10 << 4);
      }
      mem_free(embryo->entry->categories);
      embryo->entry->categories = pcVar8;
    }
    else {
      peVar9 = (embryonic_category_reference *)mem_alloc((long)wVar16 * 0x18);
      if (L'\0' < ind) {
        memcpy(peVar9,embryo->categories,(ulong)(uint)ind * 0x18);
      }
      peVar9[ind].name = categories[local_58];
      peVar9[ind].psource_index = psource_index;
      peVar9[ind].priority = priority;
      peVar9[ind].priority_set = priority_set;
      wVar4 = embryo->entry->n_category;
      iVar10 = wVar4 - ind;
      if (iVar10 != 0 && ind <= wVar4) {
        memcpy(peVar9 + (long)ind + 1,embryo->categories + ind,(long)iVar10 * 0x18);
      }
      mem_free(embryo->categories);
      embryo->categories = peVar9;
    }
  }
  else if (embryo->exists == false) {
    lVar11 = (long)ind;
    if (ind < wVar4) {
      lVar12 = lVar13 * 0x18;
      do {
        peVar9 = embryo->categories;
        *(undefined8 *)(&peVar9->priority_set + lVar12) =
             *(undefined8 *)((long)peVar9 + lVar12 + -8);
        puVar3 = (undefined8 *)((long)&peVar9[-1].name + lVar12);
        uVar5 = puVar3[1];
        puVar2 = (undefined8 *)((long)&peVar9->name + lVar12);
        *puVar2 = *puVar3;
        puVar2[1] = uVar5;
        lVar13 = lVar13 + -1;
        lVar12 = lVar12 + -0x18;
      } while (lVar11 < lVar13);
    }
    peVar9 = embryo->categories;
    peVar9[lVar11].name = categories[local_58];
    peVar9[lVar11].psource_index = psource_index;
    peVar9[lVar11].priority = priority;
    peVar9[lVar11].priority_set = priority_set;
  }
  else {
    if (ind < wVar4) {
      lVar11 = lVar13 << 4;
      do {
        pcVar8 = embryo->entry->categories;
        puVar3 = (undefined8 *)((long)&pcVar8[-1].name + lVar11);
        uVar5 = puVar3[1];
        puVar2 = (undefined8 *)((long)&pcVar8->name + lVar11);
        *puVar2 = *puVar3;
        puVar2[1] = uVar5;
        lVar13 = lVar13 + -1;
        lVar11 = lVar11 + -0x10;
      } while (ind < lVar13);
    }
    pcVar8 = embryo->entry->categories;
    pcVar8[ind].name = categories[local_58];
    pcVar8[ind].priority = priority;
    pcVar8[ind].priority_set = priority_set;
  }
  pwVar1 = &embryo->entry->n_category;
  *pwVar1 = *pwVar1 + L'\x01';
  return;
}

Assistant:

static void insert_embryo_category(struct embryonic_ui_entry *embryo,
	const char *name, int psource_index, int priority, bool priority_set,
	int ind)
{
	int cind;

	if (! search_categories(name, &cind)) {
		if (n_category == nalloc_category) {
			char **extended;

			if (n_category > INT_MAX / 2) {
				quit("Too many categories");
			}
			nalloc_category = (nalloc_category == 0) ?
				8 : nalloc_category * 2;
			extended = mem_alloc(nalloc_category *
				sizeof(*extended));
			if (cind > 0) {
				memcpy(extended, categories,
					cind * sizeof(*extended));
			}
			extended[cind] = string_make(name);
			if (cind < n_category) {
				memcpy(extended + cind + 1, categories + cind,
					(n_category - cind) *
					sizeof(*extended));
			}
			mem_free(categories);
			categories = extended;
		} else {
			int i;

			for (i = n_category; i > cind; --i) {
				categories[i] = categories[i - 1];
			}
			categories[cind] = string_make(name);
		}
		++n_category;
	}
	if (embryo->entry->n_category == embryo->entry->nalloc_category) {
		if (embryo->entry->nalloc_category > INT_MAX / 2) {
			quit("Too many categories for an ui_entry");
		}
		embryo->entry->nalloc_category =
			(embryo->entry->nalloc_category == 0) ?
			4 : 2 * embryo->entry->nalloc_category;
		if (embryo->exists) {
			struct category_reference *extended =
				mem_alloc(embryo->entry->nalloc_category *
				sizeof(*extended));

			if (ind > 0) {
				(void) memcpy(extended,
					embryo->entry->categories,
					ind * sizeof(*extended));
			}
			extended[ind].name = categories[cind];
			extended[ind].priority = priority;
			extended[ind].priority_set = priority_set;
			if (ind < embryo->entry->n_category) {
				(void) memcpy(extended + ind + 1,
					embryo->entry->categories + ind,
					(embryo->entry->n_category - ind) *
					sizeof(*extended));
			}
			mem_free(embryo->entry->categories);
			embryo->entry->categories = extended;
		} else {
			struct embryonic_category_reference *extended =
				mem_alloc(embryo->entry->nalloc_category *
				sizeof(*extended));

			if (ind > 0) {
				(void) memcpy(extended,
					embryo->categories,
					ind * sizeof(*extended));
			}
			extended[ind].name = categories[cind];
			extended[ind].psource_index = psource_index;
			extended[ind].priority = priority;
			extended[ind].priority_set = priority_set;
			if (ind < embryo->entry->n_category) {
				(void) memcpy(extended + ind + 1,
					embryo->categories + ind,
					(embryo->entry->n_category - ind) *
					sizeof(*extended));
			}
			mem_free(embryo->categories);
			embryo->categories = extended;
		}
	} else {
		int i;

		if (embryo->exists) {
			for (i = embryo->entry->n_category; i > ind; --i) {
				embryo->entry->categories[i] =
					embryo->entry->categories[i - 1];
			}
			embryo->entry->categories[ind].name = categories[cind];
			embryo->entry->categories[ind].priority = priority;
			embryo->entry->categories[ind].priority_set =
				priority_set;
		} else {
			for (i = embryo->entry->n_category; i > ind; --i) {
				embryo->categories[i] =
					embryo->categories[i - 1];
			}
			embryo->categories[ind].name = categories[cind];
			embryo->categories[ind].psource_index = psource_index;
			embryo->categories[ind].priority = priority;
			embryo->categories[ind].priority_set = priority_set;
		}
	}
	++embryo->entry->n_category;
}